

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O2

int * Cudd_SupportIndex(DdManager *dd,DdNode *f)

{
  int *support;
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = dd->size;
  if (dd->size < dd->sizeZ) {
    uVar2 = dd->sizeZ;
  }
  support = (int *)malloc((long)(int)uVar2 << 2);
  if (support == (int *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    uVar1 = 0;
    uVar3 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar3 = uVar1;
    }
    for (; uVar3 != uVar1; uVar1 = uVar1 + 1) {
      support[uVar1] = 0;
    }
    ddSupportStep((DdNode *)((ulong)f & 0xfffffffffffffffe),support);
    ddClearFlag((DdNode *)((ulong)f & 0xfffffffffffffffe));
  }
  return support;
}

Assistant:

int *
Cudd_SupportIndex(
  DdManager * dd /* manager */,
  DdNode * f /* DD whose support is sought */)
{
    int *support;
    int i;
    int size;

    /* Allocate and initialize support array for ddSupportStep. */
    size = ddMax(dd->size, dd->sizeZ);
    support = ABC_ALLOC(int,size);
    if (support == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < size; i++) {
        support[i] = 0;
    }

    /* Compute support and clean up markers. */
    ddSupportStep(Cudd_Regular(f),support);
    ddClearFlag(Cudd_Regular(f));

    return(support);

}